

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set_test.cc
# Opt level: O3

void leveldb::_Test_OverlapSequenceChecks::_RunIt(void)

{
  _Test_OverlapSequenceChecks t;
  FindFileTest local_28;
  
  local_28.disjoint_sorted_files_ = true;
  local_28.files_.
  super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_28.files_.
  super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28.files_.
  super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _Run((_Test_OverlapSequenceChecks *)&local_28);
  FindFileTest::~FindFileTest(&local_28);
  return;
}

Assistant:

TEST(FindFileTest, OverlapSequenceChecks) {
  Add("200", "200", 5000, 3000);
  ASSERT_TRUE(!Overlaps("199", "199"));
  ASSERT_TRUE(!Overlaps("201", "300"));
  ASSERT_TRUE(Overlaps("200", "200"));
  ASSERT_TRUE(Overlaps("190", "200"));
  ASSERT_TRUE(Overlaps("200", "210"));
}